

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_begin_render_to_texture(rf_render_texture2d target)

{
  rf_context *prVar1;
  uint in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  
  rf_gfx_draw();
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,in_stack_00000008);
  (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)(0,0,in_stack_00000010,in_stack_00000014);
  prVar1 = rf__ctx;
  (rf__ctx->field_0).current_matrix = &(rf__ctx->field_0).projection;
  (prVar1->field_0).current_matrix_mode = RF_PROJECTION;
  rf_gfx_load_identity();
  rf_gfx_ortho(0.0,(double)in_stack_00000010,(double)in_stack_00000014,0.0,0.0,1.0);
  prVar1 = rf__ctx;
  (rf__ctx->field_0).current_matrix = &(rf__ctx->field_0).modelview;
  (prVar1->field_0).current_matrix_mode = RF_MODELVIEW;
  rf_gfx_load_identity();
  prVar1 = rf__ctx;
  (rf__ctx->field_0).current_width = in_stack_00000010;
  (prVar1->field_0).current_height = in_stack_00000014;
  return;
}

Assistant:

RF_API void rf_begin_render_to_texture(rf_render_texture2d target)
{
    rf_gfx_draw();

    rf_gfx_enable_render_texture(target.id); // Enable render target

    // Set viewport to framebuffer size
    rf_gfx_viewport(0, 0, target.texture.width, target.texture.height);

    rf_gfx_matrix_mode(RF_PROJECTION); // Switch to PROJECTION matrix
    rf_gfx_load_identity(); // Reset current matrix (PROJECTION)

    // Set orthographic GL_PROJECTION to current framebuffer size
    // NOTE: Configured top-left corner as (0, 0)
    rf_gfx_ortho(0, target.texture.width, target.texture.height, 0, 0.0f, 1.0f);

    rf_gfx_matrix_mode(RF_MODELVIEW); // Switch back to MODELVIEW matrix
    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    //rf_gfx_scalef(0.0f, -1.0f, 0.0f);      // Flip Y-drawing (?)

    // Setup current width/height for proper aspect ratio
    // calculation when using rf_begin_mode3d()
    rf_ctx.current_width = target.texture.width;
    rf_ctx.current_height = target.texture.height;
}